

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymbol * __thiscall
CTcPrsSymtab::find_or_def
          (CTcPrsSymtab *this,textchar_t *sym,size_t len,int copy_str,tcprs_undef_action action)

{
  int iVar1;
  tc_symtype_t tVar2;
  undefined4 extraout_var;
  CTcPrsSymtab *pCVar3;
  CTcSymProp *in_RDX;
  char *in_RSI;
  CTcPrsSymtab *in_RDI;
  int in_R8D;
  CTcSymProp *prop;
  CTcSymbol *entry;
  CTcPrsSymtab *curtab;
  undefined2 in_stack_ffffffffffffff78;
  tctarg_prop_id_t in_stack_ffffffffffffff7a;
  int in_stack_ffffffffffffff7c;
  CTcPrsSymtab *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *str;
  CTcSymUndef *in_stack_ffffffffffffff90;
  CTcSymProp *this_00;
  CTcPrsSymtab *local_38;
  CTcPrsSymtab *local_30;
  
  local_30 = in_RDI;
  do {
    iVar1 = (*local_30->_vptr_CTcPrsSymtab[2])(local_30,in_RSI,in_RDX);
    pCVar3 = (CTcPrsSymtab *)CONCAT44(extraout_var,iVar1);
    if (pCVar3 != (CTcPrsSymtab *)0x0) {
      (*(((CTcSymbol *)&pCVar3->_vptr_CTcPrsSymtab)->super_CTcSymbolBase).super_CVmHashEntryCS.
        super_CVmHashEntry._vptr_CVmHashEntry[0xf])();
      tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)pCVar3);
      if ((tVar2 == TC_SYM_PROP) && ((in_R8D == 1 || (in_R8D == 2)))) {
        CTcSymPropBase::set_weak((CTcSymPropBase *)pCVar3,0);
      }
      return (CTcSymbol *)pCVar3;
    }
    pCVar3 = get_parent(local_30);
    if (pCVar3 == (CTcPrsSymtab *)0x0) {
      if (in_R8D == 0) {
        CTcTokenizer::log_error(0x2b18,(ulong)in_RDX & 0xffffffff,in_RSI);
        local_38 = (CTcPrsSymtab *)CTcSymbolBase::operator_new(0x25bd52);
        CTcSymUndef::CTcSymUndef
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
LAB_0025be73:
        add_to_global_symtab
                  (in_stack_ffffffffffffff80,
                   (CTcSymbol *)
                   CONCAT44(in_stack_ffffffffffffff7c,
                            CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78)));
        return (CTcSymbol *)local_38;
      }
      if (in_R8D - 1U < 3) {
        local_38 = (CTcPrsSymtab *)CTcSymbolBase::operator_new(0x25bdad);
        str = in_RSI;
        this_00 = in_RDX;
        CTcGenTarg::new_prop_id(G_cg);
        CTcSymProp::CTcSymProp
                  (this_00,str,(size_t)local_38,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff7a)
        ;
        in_stack_ffffffffffffff80 = local_38;
        if (in_R8D == 3) {
          CTcSymPropBase::set_weak((CTcSymPropBase *)local_38,1);
        }
        if (in_R8D == 1) {
          CTcTokenizer::log_warning(0x2b19,(ulong)in_RDX & 0xffffffff,in_RSI);
        }
        goto LAB_0025be73;
      }
    }
    local_30 = get_parent(local_30);
  } while( true );
}

Assistant:

CTcSymbol *CTcPrsSymtab::find_or_def(const textchar_t *sym, size_t len,
                                     int copy_str, tcprs_undef_action action)
{
    /*
     *   Look for the symbol.  Start in the current symbol table, and work
     *   outwards to the outermost enclosing table. 
     */
    for (CTcPrsSymtab *curtab = this ; ; curtab = curtab->get_parent())
    {
        /* look for the symbol in this table */
        CTcSymbol *entry = (CTcSymbol *)curtab->find_direct(sym, len);
        if (entry != 0)
        {
            /* mark the entry as referenced */
            entry->mark_referenced();

            /* 
             *   if this is a non-weak property definition, and this is a
             *   property symbol, remove any existing weak flag from the
             *   property symbol 
             */
            if (entry->get_type() == TC_SYM_PROP
                && (action == TCPRS_UNDEF_ADD_PROP
                    || action == TCPRS_UNDEF_ADD_PROP_NO_WARNING))
                ((CTcSymProp *)entry)->set_weak(FALSE);

            /* found it - return the symbol */
            return entry;
        }

        /* 
         *   If there's no parent symbol table, the symbol is undefined.
         *   Add a new symbol according to the action parameter.  Note
         *   that we always add the new symbol at global scope, hence we
         *   add it to 'curtab', not 'this'.  
         */
        if (curtab->get_parent() == 0)
        {
            /* check which action we're being asked to perform */
            switch(action)
            {
            case TCPRS_UNDEF_ADD_UNDEF:
                /* add an "undefined" entry - log an error */
                G_tok->log_error(TCERR_UNDEF_SYM, (int)len, sym);

                /* create a new symbol of type undefined */
                entry = new CTcSymUndef(sym, len, copy_str);

                /* finish up */
                goto add_entry;

            case TCPRS_UNDEF_ADD_PROP:
            case TCPRS_UNDEF_ADD_PROP_NO_WARNING:
            case TCPRS_UNDEF_ADD_PROP_WEAK:
                {
                    /* create a new symbol of type property */
                    CTcSymProp *prop = new CTcSymProp(
                        sym, len, copy_str, G_cg->new_prop_id());

                    /* mark it as "weak" if desired */
                    if (action == TCPRS_UNDEF_ADD_PROP_WEAK)
                        prop->set_weak(TRUE);

                    /* use it as the new table entry */
                    entry = prop;
                }
                
                /* show a warning if desired */
                if (action == TCPRS_UNDEF_ADD_PROP)
                    G_tok->log_warning(TCERR_ASSUME_SYM_PROP, (int)len, sym);

                /* finish up */
                goto add_entry;

            add_entry:
                /* add the new entry to the global table */
                add_to_global_symtab(curtab, entry);

                /* return the new entry */
                return entry;
            }
        }
    }
}